

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O0

void __thiscall
slang::SourceSnippet::printTo(SourceSnippet *this,FormatBuffer *out,terminal_color highlightColor)

{
  string_view sVar1;
  FormatBuffer *pFVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  color_type local_104;
  text_style local_fc;
  string_view local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  text_style local_b4;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  type *local_90;
  type *count;
  type *start;
  unsigned_long local_78;
  iterator local_70;
  iterator __end3;
  iterator __begin3;
  SmallVector<std::pair<unsigned_long,_unsigned_long>,_4UL> *__range3;
  string_view view;
  size_t index;
  string_view local_30;
  terminal_color local_19;
  FormatBuffer *pFStack_18;
  terminal_color highlightColor_local;
  FormatBuffer *out_local;
  SourceSnippet *this_local;
  
  local_19 = highlightColor;
  pFStack_18 = out;
  out_local = (FormatBuffer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"\n");
  FormatBuffer::append(out,local_30);
  bVar3 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::empty
                    (&(this->invalidRanges).
                      super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>);
  pFVar2 = pFStack_18;
  if (bVar3) {
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->snippetLine);
    FormatBuffer::append(pFVar2,sVar1);
  }
  else {
    view._M_str = (char *)0x0;
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->snippetLine);
    view._M_len = auVar4._8_8_;
    __range3 = auVar4._0_8_;
    __begin3 = (iterator)&this->invalidRanges;
    __end3 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::begin
                       ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)__begin3);
    local_70 = SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::end
                         ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)__begin3);
    for (; pFVar2 = pFStack_18, __end3 != local_70; __end3 = __end3 + 1) {
      start = (type *)__end3->first;
      local_78 = __end3->second;
      count = std::get<0ul,unsigned_long,unsigned_long>
                        ((pair<unsigned_long,_unsigned_long> *)&start);
      local_90 = std::get<1ul,unsigned_long,unsigned_long>
                           ((pair<unsigned_long,_unsigned_long> *)&start);
      pFVar2 = pFStack_18;
      if ((char *)*count < view._M_str) {
        assert::assertFailed
                  ("start >= index",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/diagnostics/TextDiagnosticClient.cpp"
                   ,0x118,
                   "void slang::SourceSnippet::printTo(FormatBuffer &, fmt::v9::terminal_color)");
      }
      local_a0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,
                            (size_type)view._M_str,*count - (long)view._M_str);
      FormatBuffer::append(pFVar2,local_a0);
      pFVar2 = pFStack_18;
      ::fmt::v9::text_style::text_style(&local_b4,reverse);
      local_c8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,*count,
                            *local_90);
      FormatBuffer::append(pFVar2,&local_b4,local_c8);
      view._M_str = (char *)(*count + *local_90);
    }
    local_d8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,
                          (size_type)view._M_str,0xffffffffffffffff);
    FormatBuffer::append(pFVar2,local_d8);
  }
  pFVar2 = pFStack_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"\n");
  FormatBuffer::append(pFVar2,local_e8);
  pFVar2 = pFStack_18;
  ::fmt::v9::detail::color_type::color_type(&local_104,local_19);
  ::fmt::v9::fg(&local_fc,local_104);
  sVar1 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->highlightLine);
  FormatBuffer::append(pFVar2,&local_fc,sVar1);
  return;
}

Assistant:

void printTo(FormatBuffer& out, fmt::v9::terminal_color highlightColor) {
        out.append("\n");

        if (invalidRanges.empty()) {
            out.append(snippetLine);
        }
        else {
            size_t index = 0;
            string_view view = snippetLine;
            for (auto [start, count] : invalidRanges) {
                ASSERT(start >= index);
                out.append(view.substr(index, start - index));

                out.append(fmt::emphasis::reverse, view.substr(start, count));
                index = start + count;
            }

            out.append(view.substr(index));
        }

        out.append("\n");
        out.append(fg(highlightColor), highlightLine);
    }